

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void __thiscall
duckdb::UpdateSegment::Update
          (UpdateSegment *this,TransactionData transaction,idx_t column_index,Vector *update_p,
          row_t *ids,idx_t count,Vector *base_data)

{
  uint *__last;
  long lVar1;
  data_ptr_t pdVar2;
  initialize_update_function_t p_Var3;
  merge_update_function_t p_Var4;
  long lVar5;
  shared_ptr<duckdb::BlockHandle,_true> *psVar6;
  UndoBufferReference *pUVar7;
  transaction_t tVar8;
  optional_ptr<duckdb::UndoBufferEntry,_true> __first;
  int iVar9;
  idx_t i_1;
  idx_t iVar10;
  pointer pUVar11;
  reference pvVar12;
  TransactionException *this_00;
  idx_t iVar13;
  data_ptr_t pdVar14;
  uint uVar15;
  ulong uVar16;
  UpdateInfo *pUVar17;
  UpdateInfo *pUVar18;
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *this_01;
  ulong uVar19;
  uint *__i;
  shared_ptr<duckdb::BlockHandle,_true> *__last_00;
  ulong uVar20;
  UndoBufferPointer UVar21;
  SelectionVector sorted_sel;
  SelectionVector sel;
  UndoBufferReference root_pin;
  UndoBufferReference node_ref;
  value_type root_pointer;
  UnifiedVectorFormat update_format;
  idx_t local_198;
  UpdateInfo *local_190;
  string local_180;
  ulong local_160;
  UndoBufferReference local_158;
  UpdateInfo *local_130;
  SelectionVector local_128;
  idx_t local_110;
  UndoBufferReference local_108;
  UndoBufferReference local_e0;
  Vector *local_b8;
  undefined1 local_b0 [16];
  idx_t iStack_a0;
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *local_90;
  UndoBufferPointer local_88;
  UnifiedVectorFormat local_78;
  
  local_110 = column_index;
  local_b8 = base_data;
  StorageLock::GetExclusiveLock((StorageLock *)local_b0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(update_p,count,&local_78);
  local_128.sel_vector = (sel_t *)0x0;
  local_128.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_128.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this->stats_lock);
  if (iVar9 != 0) {
    ::std::__throw_system_error(iVar9);
  }
  iVar10 = (*this->statistics_update_function)(this,&this->stats,&local_78,count,&local_128);
  pthread_mutex_unlock((pthread_mutex_t *)&this->stats_lock);
  if (iVar10 != 0) {
    local_198 = 1;
    local_108.entry.ptr = (UndoBufferEntry *)ids;
    if (iVar10 != 1) {
      iVar13 = 1;
LAB_005fd5ff:
      if ((UndoBufferEntry *)local_128.sel_vector == (UndoBufferEntry *)0x0) {
        uVar20 = iVar13 - 1;
        uVar16 = iVar13;
      }
      else {
        uVar20 = (ulong)*(uint *)((long)local_128.sel_vector + iVar13 * 4 + -4);
        uVar16 = (ulong)*(uint *)((long)(BufferManager **)local_128.sel_vector + iVar13 * 4);
      }
      if (ids[uVar20] < ids[uVar16]) goto code_r0x005fd61e;
      SelectionVector::SelectionVector((SelectionVector *)&local_158,iVar10);
      __first.ptr = local_158.entry.ptr;
      iVar13 = 0;
      do {
        uVar15 = (uint)iVar13;
        if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
          uVar15 = *(uint *)((long)(BufferManager **)local_128.sel_vector + iVar13 * 4);
        }
        *(uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar13 * 4) = uVar15;
        iVar13 = iVar13 + 1;
      } while (iVar10 != iVar13);
      __last = (uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar10 * 4);
      lVar5 = 0x3f;
      if (iVar10 != 0) {
        for (; iVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      ::std::
      __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                ((uint *)local_158.entry.ptr,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                  )&local_108);
      if ((long)iVar10 < 0x11) {
        ::std::
        __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                  ((uint *)__first.ptr,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                    )&local_108);
      }
      else {
        __last_00 = &__first.ptr[1].block;
        ::std::
        __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                  ((uint *)__first.ptr,(uint *)__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                    )&local_108);
        do {
          uVar20 = (ulong)*(uint *)((long)(__last_00 + -1) + 0xc);
          uVar15 = *(uint *)&(__last_00->internal).
                             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
          lVar5 = ids[uVar15];
          lVar1 = ids[uVar20];
          psVar6 = __last_00;
          while (lVar5 < lVar1) {
            *(uint *)&(psVar6->internal).
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (uint)uVar20;
            uVar20 = (ulong)*(uint *)((long)(psVar6 + -1) + 8);
            psVar6 = (shared_ptr<duckdb::BlockHandle,_true> *)((long)(psVar6 + -1) + 0xc);
            lVar1 = ids[uVar20];
          }
          *(uint *)&(psVar6->internal).
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               uVar15;
          __last_00 = (shared_ptr<duckdb::BlockHandle,_true> *)
                      ((long)&(__last_00->internal).
                              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 4);
        } while (__last_00 != (shared_ptr<duckdb::BlockHandle,_true> *)__last);
      }
      iVar13 = 1;
      local_198 = 1;
      do {
        if (local_158.entry.ptr == (UndoBufferEntry *)0x0) {
          uVar20 = iVar13 - 1;
          uVar16 = iVar13;
        }
        else {
          uVar20 = (ulong)*(uint *)((long)local_158.entry.ptr + iVar13 * 4 + -4);
          uVar16 = (ulong)*(uint *)((long)&(local_158.entry.ptr)->buffer_manager + iVar13 * 4);
        }
        if (ids[uVar20] != ids[uVar16]) {
          *(uint *)((long)&(local_158.entry.ptr)->buffer_manager + local_198 * 4) = (uint)uVar16;
          local_198 = local_198 + 1;
        }
        iVar13 = iVar13 + 1;
      } while (iVar10 != iVar13);
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&local_128.selection_data,
                 (shared_ptr<duckdb::SelectionData,_true> *)&local_158.handle);
      local_128.sel_vector = (sel_t *)local_158.entry.ptr;
      if (local_158.handle.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.handle.handle.internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
LAB_005fd777:
    if ((UndoBufferEntry *)local_128.sel_vector == (UndoBufferEntry *)0x0) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)(BufferManager **)local_128.sel_vector;
    }
    iVar10 = this->column_data->start;
    uVar20 = ids[uVar20] - iVar10;
    local_160 = uVar20 >> 0xb;
    InitializeUpdateInfo(this,local_160);
    this_01 = &this->root;
    pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
              operator->(this_01);
    pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,local_160);
    iVar10 = (uVar20 & 0xfffffffffffff800) + iVar10;
    if (pvVar12->entry == (UndoBufferEntry *)0x0) {
      iVar13 = this->type_size;
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(this_01);
      UndoBufferAllocator::Allocate
                (&local_158,&pUVar11->allocator,iVar13 * 0x800 + 0x204f & 0xfffffffffffff848);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
      pdVar2 = (local_158.handle.node.ptr)->buffer;
      local_130 = (UpdateInfo *)(pdVar2 + local_158.position);
      pdVar14 = pdVar2 + local_158.position + 0x24;
      pdVar14[0] = '\0';
      pdVar14[1] = '\b';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      LOCK();
      pdVar14 = pdVar2 + local_158.position + 0x10;
      pdVar14[0] = '_';
      pdVar14[1] = '\0';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      pdVar14[4] = '\0';
      pdVar14[5] = '\0';
      pdVar14[6] = '\0';
      pdVar14[7] = '@';
      UNLOCK();
      pdVar14 = pdVar2 + local_158.position;
      pdVar14[0] = '\0';
      pdVar14[1] = '\0';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      pdVar14[4] = '\0';
      pdVar14[5] = '\0';
      pdVar14[6] = '\0';
      pdVar14[7] = '\0';
      pdVar14 = pdVar2 + local_158.position + 0x28;
      pdVar14[0] = '\0';
      pdVar14[1] = '\0';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      pdVar14[4] = '\0';
      pdVar14[5] = '\0';
      pdVar14[6] = '\0';
      pdVar14[7] = '\0';
      pdVar14 = pdVar2 + local_158.position + 0x38;
      pdVar14[0] = '\0';
      pdVar14[1] = '\0';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      pdVar14[4] = '\0';
      pdVar14[5] = '\0';
      pdVar14[6] = '\0';
      pdVar14[7] = '\0';
      *(idx_t *)(pdVar2 + local_158.position + 8) = local_110;
      InitializeUpdateInfo(this,local_130,ids,&local_128,local_198,local_160,iVar10);
      local_108.entry.ptr = (UndoBufferEntry *)0x0;
      BufferHandle::BufferHandle(&local_108.handle);
      tVar8 = transaction.transaction_id;
      local_108.position = 0;
      local_180._M_dataplus._M_p = (pointer)0x0;
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        local_180._M_dataplus._M_p =
             (pointer)operator_new__(this->type_size * 0x800 + 0x204f & 0xfffffffffffff848);
        ((UpdateInfo *)local_180._M_dataplus._M_p)->max = 0x800;
        LOCK();
        (((UpdateInfo *)local_180._M_dataplus._M_p)->version_number).
        super___atomic_base<unsigned_long>._M_i = tVar8;
        UNLOCK();
        ((UpdateInfo *)local_180._M_dataplus._M_p)->segment = (UpdateSegment *)0x0;
        (((UpdateInfo *)local_180._M_dataplus._M_p)->prev).entry = (UndoBufferEntry *)0x0;
        (((UpdateInfo *)local_180._M_dataplus._M_p)->next).entry = (UndoBufferEntry *)0x0;
        local_190 = (UpdateInfo *)local_180._M_dataplus._M_p;
      }
      else {
        local_90 = this_01;
        optional_ptr<duckdb::DuckTransaction,_true>::CheckValid(&transaction.transaction);
        DuckTransaction::CreateUpdateInfo
                  (&local_e0,transaction.transaction.ptr,this->type_size,local_198);
        local_108.entry.ptr = local_e0.entry.ptr;
        BufferHandle::operator=(&local_108.handle,&local_e0.handle);
        local_108.position = local_e0.position;
        BufferHandle::~BufferHandle(&local_e0.handle);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_108.handle.node);
        local_180._M_dataplus._M_p =
             (pointer)((local_108.handle.node.ptr)->buffer + local_108.position);
        local_190 = (UpdateInfo *)0x0;
        this_01 = local_90;
      }
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      InitializeUpdateInfo
                (this,(UpdateInfo *)local_180._M_dataplus._M_p,ids,&local_128,local_198,local_160,
                 iVar10);
      p_Var3 = this->initialize_update_function;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      (*p_Var3)((UpdateInfo *)local_180._M_dataplus._M_p,local_b8,local_130,&local_78,&local_128);
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        UVar21 = (UndoBufferPointer)ZEXT816(0);
      }
      else {
        UVar21 = UndoBufferReference::GetBufferPointer(&local_108);
      }
      pdVar14 = pdVar2 + local_158.position + 0x28;
      local_130->next = UVar21;
      pdVar14[0] = '\0';
      pdVar14[1] = '\0';
      pdVar14[2] = '\0';
      pdVar14[3] = '\0';
      pdVar14[4] = '\0';
      pdVar14[5] = '\0';
      pdVar14[6] = '\0';
      pdVar14[7] = '\0';
      pdVar2 = pdVar2 + local_158.position + 0x30;
      pdVar2[0] = '\0';
      pdVar2[1] = '\0';
      pdVar2[2] = '\0';
      pdVar2[3] = '\0';
      pdVar2[4] = '\0';
      pdVar2[5] = '\0';
      pdVar2[6] = '\0';
      pdVar2[7] = '\0';
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      ((UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x38))->entry = (UndoBufferEntry *)0x0;
      *(idx_t *)(local_180._M_dataplus._M_p + 0x40) = 0;
      UVar21 = UndoBufferReference::GetBufferPointer(&local_158);
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      *(UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x28) = UVar21;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      *(idx_t *)(local_180._M_dataplus._M_p + 8) = local_110;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      UVar21 = UndoBufferReference::GetBufferPointer(&local_158);
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(this_01);
      pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,local_160);
      pvVar12->entry = UVar21.entry;
      pvVar12->position = UVar21.position;
      BufferHandle::~BufferHandle(&local_108.handle);
      if (local_190 != (UpdateInfo *)0x0) {
        operator_delete__(local_190);
      }
      pUVar7 = &local_158;
    }
    else {
      pUVar11 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
                operator->(this_01);
      pvVar12 = vector<duckdb::UndoBufferPointer,_true>::operator[](&pUVar11->info,local_160);
      local_88.entry = pvVar12->entry;
      local_88.position = pvVar12->position;
      UndoBufferPointer::Pin(&local_108,&local_88);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_108.handle.node);
      pUVar17 = (UpdateInfo *)((local_108.handle.node.ptr)->buffer + local_108.position);
      local_e0.entry.ptr = (UndoBufferEntry *)0x0;
      BufferHandle::BufferHandle(&local_e0.handle);
      tVar8 = transaction.transaction_id;
      local_e0.position = 0;
      local_b0._8_8_ = (pUVar17->next).entry;
      iStack_a0 = (pUVar17->next).position;
      local_130 = (UpdateInfo *)transaction.start_time;
      if ((UndoBufferEntry *)local_b0._8_8_ != (UndoBufferEntry *)0x0) {
        do {
          UndoBufferPointer::Pin(&local_158,(UndoBufferPointer *)(local_b0 + 8));
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
          iVar13 = local_158.position;
          pdVar14 = (local_158.handle.node.ptr)->buffer;
          if (*(transaction_t *)(pdVar14 + local_158.position + 0x10) == tVar8) {
            local_e0.entry.ptr = local_158.entry.ptr;
            BufferHandle::operator=(&local_e0.handle,&local_158.handle);
            local_e0.position = local_158.position;
          }
          else if (local_130 < *(UpdateInfo **)(pdVar14 + local_158.position + 0x10)) {
            uVar20 = 0;
            uVar16 = 0;
            do {
              while( true ) {
                uVar19 = uVar20;
                if ((UndoBufferEntry *)local_128.sel_vector != (UndoBufferEntry *)0x0) {
                  uVar19 = (ulong)*(uint *)((long)(BufferManager **)local_128.sel_vector +
                                           uVar20 * 4);
                }
                if (ids[uVar19] - iVar10 ==
                    (ulong)*(uint *)(pdVar14 + uVar16 * 4 + local_158.position + 0x48)) {
                  this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
                  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_180,"Conflict on update!","");
                  TransactionException::TransactionException(this_00,&local_180);
                  __cxa_throw(this_00,&TransactionException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                if ((long)(ids[uVar19] - iVar10) <
                    (long)(ulong)*(uint *)(pdVar14 + uVar16 * 4 + local_158.position + 0x48)) break;
                uVar16 = uVar16 + 1;
                if (uVar16 == *(uint *)(pdVar14 + local_158.position + 0x20)) goto LAB_005fd947;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_198);
          }
LAB_005fd947:
          local_b0._8_8_ = *(undefined8 *)(pdVar14 + iVar13 + 0x38);
          iStack_a0 = *(idx_t *)(pdVar14 + iVar13 + 0x40);
          BufferHandle::~BufferHandle(&local_158.handle);
        } while ((UndoBufferEntry *)local_b0._8_8_ != (UndoBufferEntry *)0x0);
      }
      tVar8 = transaction.transaction_id;
      local_180._M_dataplus._M_p = (pointer)0x0;
      if (local_e0.entry.ptr == (UndoBufferEntry *)0x0) {
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          local_180._M_dataplus._M_p =
               (pointer)operator_new__(this->type_size * 0x800 + 0x204f & 0xfffffffffffff848);
          ((UpdateInfo *)local_180._M_dataplus._M_p)->max = 0x800;
          LOCK();
          (((UpdateInfo *)local_180._M_dataplus._M_p)->version_number).
          super___atomic_base<unsigned_long>._M_i = tVar8;
          UNLOCK();
          ((UpdateInfo *)local_180._M_dataplus._M_p)->segment = (UpdateSegment *)0x0;
          (((UpdateInfo *)local_180._M_dataplus._M_p)->prev).entry = (UndoBufferEntry *)0x0;
          (((UpdateInfo *)local_180._M_dataplus._M_p)->next).entry = (UndoBufferEntry *)0x0;
          pUVar18 = (UpdateInfo *)local_180._M_dataplus._M_p;
        }
        else {
          optional_ptr<duckdb::DuckTransaction,_true>::CheckValid(&transaction.transaction);
          DuckTransaction::CreateUpdateInfo
                    (&local_158,transaction.transaction.ptr,this->type_size,local_198);
          local_e0.entry.ptr = local_158.entry.ptr;
          BufferHandle::operator=(&local_e0.handle,&local_158.handle);
          local_e0.position = local_158.position;
          BufferHandle::~BufferHandle(&local_158.handle);
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_e0.handle.node);
          local_180._M_dataplus._M_p =
               (pointer)((local_e0.handle.node.ptr)->buffer + local_e0.position);
          pUVar18 = (UpdateInfo *)0x0;
        }
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        *(UpdateSegment **)local_180._M_dataplus._M_p = this;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        *(ulong *)(local_180._M_dataplus._M_p + 0x18) = local_160;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        *(sel_t *)(local_180._M_dataplus._M_p + 0x20) = 0;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        *(idx_t *)(local_180._M_dataplus._M_p + 8) = local_110;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        iVar10 = (pUVar17->next).position;
        ((UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x38))->entry = (pUVar17->next).entry;
        *(idx_t *)(local_180._M_dataplus._M_p + 0x40) = iVar10;
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        if (((UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x38))->entry !=
            (UndoBufferEntry *)0x0) {
          optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
          UndoBufferPointer::Pin
                    (&local_158,(UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x38));
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_158.handle.node);
          pdVar14 = (local_158.handle.node.ptr)->buffer;
          UVar21 = UndoBufferReference::GetBufferPointer(&local_e0);
          *(UndoBufferEntry **)(pdVar14 + local_158.position + 0x28) = UVar21.entry;
          *(idx_t *)(pdVar14 + local_158.position + 0x30) = UVar21.position;
          BufferHandle::~BufferHandle(&local_158.handle);
        }
        optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                  ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
        ((UndoBufferPointer *)(local_180._M_dataplus._M_p + 0x28))->entry = local_88.entry;
        *(idx_t *)(local_180._M_dataplus._M_p + 0x30) = local_88.position;
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          UVar21 = (UndoBufferPointer)ZEXT816(0);
        }
        else {
          UVar21 = UndoBufferReference::GetBufferPointer(&local_e0);
        }
        pUVar17->next = UVar21;
      }
      else {
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_e0.handle.node);
        local_180._M_dataplus._M_p =
             (pointer)((local_e0.handle.node.ptr)->buffer + local_e0.position);
        pUVar18 = (UpdateInfo *)0x0;
      }
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      p_Var4 = this->merge_update_function;
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      (*p_Var4)(pUVar17,local_b8,(UpdateInfo *)local_180._M_dataplus._M_p,&local_78,ids,local_198,
                &local_128);
      optional_ptr<duckdb::UpdateInfo,_true>::CheckValid
                ((optional_ptr<duckdb::UpdateInfo,_true> *)&local_180);
      if (pUVar18 != (UpdateInfo *)0x0) {
        operator_delete__(pUVar18);
      }
      BufferHandle::~BufferHandle(&local_e0.handle);
      pUVar7 = &local_108;
    }
    BufferHandle::~BufferHandle(&pUVar7->handle);
  }
  if (local_128.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((element_type *)local_b0._0_8_ != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_b0._0_8_);
    operator_delete((void *)local_b0._0_8_);
  }
  return;
code_r0x005fd61e:
  iVar13 = iVar13 + 1;
  local_198 = iVar10;
  if (iVar10 == iVar13) goto LAB_005fd777;
  goto LAB_005fd5ff;
}

Assistant:

void UpdateSegment::Update(TransactionData transaction, idx_t column_index, Vector &update_p, row_t *ids, idx_t count,
                           Vector &base_data) {
	// obtain an exclusive lock
	auto write_lock = lock.GetExclusiveLock();

	UnifiedVectorFormat update_format;
	update_p.ToUnifiedFormat(count, update_format);

	// update statistics
	SelectionVector sel;
	{
		lock_guard<mutex> stats_guard(stats_lock);
		count = statistics_update_function(this, stats, update_format, count, sel);
	}
	if (count == 0) {
		return;
	}

	// subsequent algorithms used by the update require row ids to be (1) sorted, and (2) unique
	// this is usually the case for "standard" queries (e.g. UPDATE tbl SET x=bla WHERE cond)
	// however, for more exotic queries involving e.g. cross products/joins this might not be the case
	// hence we explicitly check here if the ids are sorted and, if not, sort + duplicate eliminate them
	count = SortSelectionVector(sel, count, ids);
	D_ASSERT(count > 0);

	// get the vector index based on the first id
	// we assert that all updates must be part of the same vector
	auto first_id = ids[sel.get_index(0)];
	idx_t vector_index = (UnsafeNumericCast<idx_t>(first_id) - column_data.start) / STANDARD_VECTOR_SIZE;
	idx_t vector_offset = column_data.start + vector_index * STANDARD_VECTOR_SIZE;
	InitializeUpdateInfo(vector_index);

	D_ASSERT(idx_t(first_id) >= column_data.start);

	if (root->info[vector_index].IsSet()) {
		// there is already a version here, check if there are any conflicts and search for the node that belongs to
		// this transaction in the version chain
		auto root_pointer = root->info[vector_index];
		auto root_pin = root_pointer.Pin();
		auto &base_info = UpdateInfo::Get(root_pin);

		UndoBufferReference node_ref;
		CheckForConflicts(base_info.next, transaction, ids, sel, count, UnsafeNumericCast<row_t>(vector_offset),
		                  node_ref);

		// there are no conflicts - continue with the update
		unsafe_unique_array<char> update_info_data;
		optional_ptr<UpdateInfo> node;
		if (!node_ref.IsSet()) {
			// no updates made yet by this transaction: initially the update info to empty
			if (transaction.transaction) {
				auto &dtransaction = transaction.transaction->Cast<DuckTransaction>();
				node_ref = dtransaction.CreateUpdateInfo(type_size, count);
				node = &UpdateInfo::Get(node_ref);
			} else {
				node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
			}
			node->segment = this;
			node->vector_index = vector_index;
			node->N = 0;
			node->column_index = column_index;

			// insert the new node into the chain
			node->next = base_info.next;
			if (node->next.IsSet()) {
				auto next_pin = node->next.Pin();
				auto &next_info = UpdateInfo::Get(next_pin);
				next_info.prev = node_ref.GetBufferPointer();
			}
			node->prev = root_pointer;
			base_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		} else {
			// we already had updates made to this transaction
			node = &UpdateInfo::Get(node_ref);
		}
		base_info.Verify();
		node->Verify();

		// now we are going to perform the merge
		merge_update_function(base_info, base_data, *node, update_format, ids, count, sel);

		base_info.Verify();
		node->Verify();
	} else {
		// there is no version info yet: create the top level update info and fill it with the updates
		// allocate space for the UpdateInfo in the allocator
		idx_t alloc_size = UpdateInfo::GetAllocSize(type_size);
		auto handle = root->allocator.Allocate(alloc_size);
		auto &update_info = UpdateInfo::Get(handle);
		UpdateInfo::Initialize(update_info, TRANSACTION_ID_START - 1);
		update_info.column_index = column_index;

		InitializeUpdateInfo(update_info, ids, sel, count, vector_index, vector_offset);

		// now create the transaction level update info in the undo log
		unsafe_unique_array<char> update_info_data;
		UndoBufferReference node_ref;
		optional_ptr<UpdateInfo> transaction_node;
		if (transaction.transaction) {
			node_ref = transaction.transaction->CreateUpdateInfo(type_size, count);
			transaction_node = &UpdateInfo::Get(node_ref);
		} else {
			transaction_node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
		}

		InitializeUpdateInfo(*transaction_node, ids, sel, count, vector_index, vector_offset);

		// we write the updates in the update node data, and write the updates in the info
		initialize_update_function(*transaction_node, base_data, update_info, update_format, sel);

		update_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		update_info.prev = UndoBufferPointer();
		transaction_node->next = UndoBufferPointer();
		transaction_node->prev = handle.GetBufferPointer();
		transaction_node->column_index = column_index;

		transaction_node->Verify();
		update_info.Verify();

		root->info[vector_index] = handle.GetBufferPointer();
	}
}